

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supdup.c
# Opt level: O1

void supdup_closing(Plug *plug,PlugCloseType type,char *error_msg)

{
  if (plug[-0x12].vt != (PlugVtable *)0x0) {
    (**(code **)((plug[-0x12].vt)->log + 8))();
    plug[-0x12].vt = (PlugVtable *)0x0;
    if (error_msg != (char *)0x0) {
      *(undefined1 *)((long)&plug[-0x11].vt + 1) = 1;
    }
    (**(code **)((plug[-0x10].vt)->log + 0x30))();
    (**(code **)((plug[-0x10].vt)->log + 0x38))();
  }
  if (type != PLUGCLOSE_NORMAL) {
    logevent((LogContext *)plug[-0xf].vt,error_msg);
    if (type != PLUGCLOSE_USER_ABORT) {
      seat_connection_fatal((Seat *)plug[-0x10].vt,"%s",error_msg);
      return;
    }
  }
  return;
}

Assistant:

static void supdup_closing(Plug *plug, PlugCloseType type,
                           const char *error_msg)
{
    Supdup *supdup = container_of(plug, Supdup, plug);

    /*
     * We don't implement independent EOF in each direction for Telnet
     * connections; as soon as we get word that the remote side has
     * sent us EOF, we wind up the whole connection.
     */

    if (supdup->s) {
        sk_close(supdup->s);
        supdup->s = NULL;
        if (error_msg)
            supdup->closed_on_socket_error = true;
        seat_notify_remote_exit(supdup->seat);
        seat_notify_remote_disconnect(supdup->seat);
    }
    if (type != PLUGCLOSE_NORMAL) {
        logevent(supdup->logctx, error_msg);
        if (type != PLUGCLOSE_USER_ABORT)
            seat_connection_fatal(supdup->seat, "%s", error_msg);
    }
    /* Otherwise, the remote side closed the connection normally. */
}